

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManUtilSkipUntil(Prs_Man_t *p,char c)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  pcVar1 = p->pLimit;
  pcVar2 = p->pCur;
  do {
    if (pcVar1 <= pcVar2) {
      return 0;
    }
    cVar4 = *pcVar2;
    if (cVar4 == '/') {
      if (pcVar2[1] == '*') {
        pcVar2 = pcVar2 + 2;
        p->pCur = pcVar2;
        if (pcVar2 < pcVar1) {
          do {
            if ((*pcVar2 == '*') && (pcVar2[1] == '/')) {
              pcVar3 = pcVar2 + 2;
              goto LAB_003f00aa;
            }
            pcVar2 = pcVar2 + 1;
            p->pCur = pcVar2;
          } while (pcVar2 != pcVar1);
        }
LAB_003f0081:
        cVar4 = *pcVar2;
        goto LAB_003f0084;
      }
      if (pcVar2[1] == '/') {
        pcVar2 = pcVar2 + 2;
        p->pCur = pcVar2;
        if (pcVar2 < pcVar1) {
          do {
            cVar4 = *pcVar2;
            pcVar2 = pcVar2 + 1;
            pcVar3 = pcVar2;
            if (cVar4 == '\n') goto LAB_003f00aa;
            p->pCur = pcVar2;
          } while (pcVar2 != pcVar1);
        }
        goto LAB_003f0081;
      }
LAB_003f00a4:
      pcVar3 = pcVar2 + 1;
    }
    else {
      if (cVar4 == ';') {
        return 1;
      }
LAB_003f0084:
      if (cVar4 != '\\') goto LAB_003f00a4;
      pcVar2 = pcVar2 + 1;
      do {
        p->pCur = pcVar2;
        if (pcVar1 <= pcVar2) goto LAB_003f00a4;
        pcVar3 = pcVar2 + 1;
        cVar4 = *pcVar2;
        pcVar2 = pcVar3;
      } while (cVar4 != ' ');
    }
LAB_003f00aa:
    p->pCur = pcVar3;
    pcVar2 = pcVar3;
  } while( true );
}

Assistant:

static inline int Prs_ManUtilSkipUntil( Prs_Man_t * p, char c )
{
    while ( p->pCur < p->pLimit )
    {
        if ( Prs_ManIsChar(p, c) )
            return 1;
        if ( Prs_ManUtilSkipComments(p) )
            continue;
        if ( Prs_ManUtilSkipName(p) )
            continue;
        p->pCur++;
    }
    return 0;
}